

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryCamerasLoader.cpp
# Opt level: O3

bool __thiscall COLLADASaxFWL::LibraryCamerasLoader::end__camera(LibraryCamerasLoader *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DescriptionType DVar2;
  uint uVar3;
  
  uVar3 = ((uint)this->mCurrentCameraHasX + (uint)this->mCurrentCameraHasY * 2 +
          (uint)this->mCurrentCameraHasAspectRatio * 4) - 1;
  DVar2 = UNDEFINED;
  if (uVar3 < 6) {
    DVar2 = *(DescriptionType *)(&DAT_00837b90 + (ulong)uVar3 * 4);
  }
  this->mCurrentCamera->mDescriptionType = DVar2;
  iVar1 = FilePartLoader::getObjectFlags(&this->super_FilePartLoader);
  if ((char)iVar1 < '\0') {
    iVar1 = (*(this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
              _vptr_ExtraDataLoader[2])(this);
    DocumentProcessor::addCamera
              ((DocumentProcessor *)CONCAT44(extraout_var,iVar1),this->mCurrentCamera);
  }
  *(undefined4 *)((long)&this->mCurrentCamera + 7) = 0;
  this->mCurrentCamera = (Camera *)0x0;
  iVar1 = (*(this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[2])(this);
  DocumentProcessor::moveUpInSidTree((DocumentProcessor *)CONCAT44(extraout_var_00,iVar1));
  return true;
}

Assistant:

bool LibraryCamerasLoader::end__camera()
	{
		// we need to determine the description type
		// X = 1, Y = 2, aspect ratio = 4
		int descriptionType = (mCurrentCameraHasX ? 1 : 0) +
							  (mCurrentCameraHasY ? 2 : 0) +
							  (mCurrentCameraHasAspectRatio ? 4 : 0);
		switch ( descriptionType )
		{
		case 1:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::SINGLE_X);
			break;
		case 2:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::SINGLE_Y);
			break;
		case 3:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::X_AND_Y);
			break;
		case 5:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::ASPECTRATIO_AND_X);
			break;
		case 6:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::ASPECTRATIO_AND_Y);
			break;
		default:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::UNDEFINED);
		}

		bool success = true;
		if ( (getObjectFlags() & Loader::CAMERA_FLAG) != 0 )
		{
			getFileLoader()->addCamera( mCurrentCamera );
		}
		resetCurrentValues();
		getFileLoader()->moveUpInSidTree();
		return success;
	}